

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

wchar_t square_door_power(chunk_conflict2 *c,loc_conflict grid)

{
  _Bool _Var1;
  trap_kind_conflict *ptVar2;
  trap *local_30;
  trap *trap;
  trap_kind_conflict *lock;
  chunk_conflict2 *c_local;
  loc_conflict grid_local;
  
  ptVar2 = lookup_trap("door lock");
  _Var1 = square_iscloseddoor((chunk *)c,grid);
  if ((_Var1) && (_Var1 = square_trap_specific(c,grid,ptVar2->tidx), _Var1)) {
    for (local_30 = square_trap((chunk *)c,grid); local_30 != (trap *)0x0; local_30 = local_30->next
        ) {
      if (local_30->kind == ptVar2) {
        return (uint)local_30->power;
      }
    }
  }
  return L'\0';
}

Assistant:

int square_door_power(struct chunk *c, struct loc grid)
{
	struct trap_kind *lock = lookup_trap("door lock");
	struct trap *trap;

	/* Verify it's a closed door */
	if (!square_iscloseddoor(c, grid))
		return 0;

	/* Is there a lock there? */
	if (!square_trap_specific(c, grid, lock->tidx))
		return 0;

	/* Get the power and return it */
	trap = square_trap(c, grid);
	while (trap) {
		if (trap->kind == lock)
			return trap->power;
		trap = trap->next;
	}

	return 0;
}